

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::writeData
          (AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
          ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  size_t sVar1;
  Vector<double,_3U> *v;
  int i;
  long lVar2;
  Vector3d dat;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&dat.super_Vector<double,_3U>);
  sVar1 = (this->super_Vector3dAccumulator).Count_;
  switch(dataHandling) {
  case Average:
    v = &(this->super_Vector3dAccumulator).Avg_;
    break;
  case Last:
    v = &(this->super_Vector3dAccumulator).Val_;
    break;
  case Max:
  case Min:
    memcpy(&painCave,"Max and Min functions are not defined for a std::vector Accumulator.",0x45);
    painCave.isFatal = 1;
    simError();
    goto switchD_001f23ce_default;
  case Total:
    v = &(this->super_Vector3dAccumulator).Total_;
    break;
  default:
    goto switchD_001f23ce_default;
  }
  Vector<double,_3U>::Vector(&local_48,v);
  Vector3<double>::operator=(&dat,&local_48);
switchD_001f23ce_default:
  for (lVar2 = 0; Vector<double,_3U>::Vector(&local_48,&(this->super_Vector3dAccumulator).Avg_),
      lVar2 != 3; lVar2 = lVar2 + 1) {
    if ((ulong)ABS(dat.super_Vector<double,_3U>.data_[lVar2]) < 0x7ff0000000000000) {
      std::operator<<(stream,"\t");
      if (sVar1 != 0) {
        std::ostream::_M_insert<double>(dat.super_Vector<double,_3U>.data_[lVar2]);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      Vector3d dat;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = Vector3dAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = Vector3dAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = Vector3dAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << dat[i];
        }
      }
    }